

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_relative_path(Twine *path,Style style)

{
  uint *puVar1;
  StringRef path_00;
  StringRef SVar2;
  undefined1 local_b0 [8];
  SmallString<128U> path_storage;
  
  puVar1 = &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_b0 = (undefined1  [8])puVar1;
  path_00 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_b0);
  SVar2 = root_path(path_00,style);
  if (local_b0 != (undefined1  [8])puVar1) {
    free((void *)local_b0);
  }
  return SVar2.Length < path_00.Length;
}

Assistant:

bool has_relative_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !relative_path(p, style).empty();
}